

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactions.cc
# Opt level: O1

void INTERACTIONS::eval_count_of_generated_ft
               (vw *all,example *ec,size_t *new_features_cnt,float *new_features_value)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  pointer pbVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  long lVar11;
  int64_t d;
  long lVar12;
  long lVar13;
  features *pfVar14;
  ulong uVar15;
  iterator __begin2;
  pointer pbVar16;
  iterator __end2;
  long lVar17;
  ulong uVar18;
  long lVar19;
  char *pcVar20;
  bool bVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  v_array<float> results;
  float local_8c;
  v_array<float> local_88;
  size_t *local_60;
  float *local_58;
  features *local_50;
  pointer local_48;
  pointer local_40;
  long local_38;
  
  *new_features_cnt = 0;
  *new_features_value = 0.0;
  local_88.end_array = (float *)0x0;
  local_88.erase_count = 0;
  local_88._begin = (float *)0x0;
  local_88._end = (float *)0x0;
  pbVar16 = (all->interactions).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (all->interactions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = new_features_cnt;
  local_58 = new_features_value;
  if (all->permutations == true) {
    for (; pbVar16 != pbVar4; pbVar16 = pbVar16 + 1) {
      if (pbVar16->_M_string_length == 0) {
        lVar5 = 1;
        fVar24 = 1.0;
      }
      else {
        lVar5 = 1;
        fVar24 = 1.0;
        lVar8 = 0;
        do {
          bVar2 = (pbVar16->_M_dataplus)._M_p[lVar8];
          lVar5 = ((long)(ec->super_example_predict).feature_space[bVar2].values._end -
                   (long)(ec->super_example_predict).feature_space[bVar2].values._begin >> 2) *
                  lVar5;
          fVar24 = fVar24 * (ec->super_example_predict).feature_space[bVar2].sum_feat_sq;
          if (lVar5 == 0) break;
          bVar21 = pbVar16->_M_string_length - 1 != lVar8;
          lVar8 = lVar8 + 1;
        } while (bVar21);
      }
      if (lVar5 != 0) {
        *new_features_cnt = *new_features_cnt + lVar5;
        *new_features_value = fVar24 + *new_features_value;
      }
    }
  }
  else if (pbVar16 != pbVar4) {
    pfVar14 = (ec->super_example_predict).feature_space;
    local_50 = pfVar14;
    local_48 = pbVar4;
    do {
      if (pbVar16->_M_string_length == 0) {
        lVar5 = 1;
        fVar24 = 1.0;
      }
      else {
        pcVar20 = (pbVar16->_M_dataplus)._M_p;
        pcVar6 = pcVar20 + pbVar16->_M_string_length;
        lVar5 = 1;
        fVar24 = 1.0;
        local_40 = pbVar16;
        do {
          if (pcVar20 == pcVar6 + -1) {
LAB_0023c317:
            cVar3 = *pcVar20;
            lVar5 = ((long)pfVar14[cVar3].values._end - (long)pfVar14[cVar3].values._begin >> 2) *
                    lVar5;
            fVar24 = fVar24 * pfVar14[cVar3].sum_feat_sq;
            if (lVar5 == 0) break;
          }
          else {
            cVar3 = *pcVar20;
            if (cVar3 != pcVar20[1]) goto LAB_0023c317;
            uVar18 = 2;
            if (pcVar20 + 2 < pcVar6) {
              lVar8 = 2;
              do {
                uVar18 = uVar18 + (cVar3 == pcVar20[lVar8]);
                lVar8 = lVar8 + 1;
              } while ((long)pcVar6 - (long)pcVar20 != lVar8);
            }
            local_38 = lVar5;
            if (local_88._end != local_88._begin) {
              uVar9 = 0;
              do {
                local_88._begin[uVar9] = 0.0;
                uVar9 = uVar9 + 1;
              } while (uVar9 < (ulong)((long)local_88._end - (long)local_88._begin >> 2));
            }
            while ((ulong)((long)local_88._end - (long)local_88._begin >> 2) < uVar18) {
              local_8c = 0.0;
              v_array<float>::push_back(&local_88,&local_8c);
            }
            pfVar14 = local_50 + cVar3;
            pfVar10 = (pfVar14->values)._begin;
            if ((pfVar14->values)._end == pfVar10) {
              uVar9 = 0;
              uVar15 = 0;
            }
            else {
              uVar15 = 0;
              do {
                fVar23 = pfVar10[uVar15] * pfVar10[uVar15];
                *local_88._begin = *local_88._begin + fVar23;
                if (1 < uVar18) {
                  uVar9 = 1;
                  do {
                    local_88._begin[uVar9] =
                         local_88._begin[uVar9 - 1] * fVar23 + local_88._begin[uVar9];
                    uVar9 = uVar9 + 1;
                  } while (uVar18 != uVar9);
                }
                uVar15 = uVar15 + 1;
                pfVar10 = (pfVar14->values)._begin;
                uVar9 = (long)(pfVar14->values)._end - (long)pfVar10 >> 2;
              } while (uVar15 < uVar9);
            }
            fVar24 = fVar24 * local_88._begin[uVar18 - 1];
            bVar21 = uVar9 < uVar18;
            if (bVar21 && uVar15 == 0) {
              lVar5 = 0;
            }
            else {
              if (uVar15 == 0) {
                if ((long)uVar18 < 0) {
                  lVar5 = 0;
                }
                else {
                  lVar5 = 0;
                  if ((((long)uVar18 <= (long)uVar9) && (lVar5 = 1, 0 < (long)uVar18)) &&
                     (uVar18 != uVar9)) {
                    uVar7 = 1;
                    do {
                      lVar5 = lVar5 * uVar9;
                      uVar9 = uVar9 - 1;
                      lVar5 = lVar5 / (long)uVar7;
                      bVar22 = uVar7 != uVar18;
                      uVar7 = uVar7 + 1;
                    } while (bVar22);
                  }
                }
              }
              else {
                uVar9 = uVar9 - uVar15;
                lVar17 = -uVar18;
                lVar8 = 0;
                lVar19 = 0;
                lVar5 = 0;
                do {
                  lVar13 = 1;
                  if (lVar19 != 0) {
                    if (lVar19 < 0) {
                      lVar13 = 0;
                    }
                    else {
                      lVar11 = (uVar15 - 1) + lVar19;
                      lVar13 = 0;
                      if ((lVar19 <= lVar11) && (lVar13 = 1, 0 < lVar19 && uVar15 - 1 != 0)) {
                        lVar12 = 1;
                        do {
                          lVar13 = lVar13 * lVar11;
                          lVar11 = lVar11 + -1;
                          lVar13 = lVar13 / lVar12;
                          lVar1 = lVar8 + lVar12;
                          lVar12 = lVar12 + 1;
                        } while (lVar1 != 0);
                      }
                    }
                  }
                  uVar7 = uVar18 - lVar19;
                  if (uVar9 < uVar7) {
                    lVar11 = 0;
                  }
                  else {
                    if ((long)uVar7 < 0 || (long)uVar9 < (long)uVar7) {
                      lVar11 = 0;
                    }
                    else {
                      lVar11 = 1;
                      if (0 < (long)uVar7 && uVar7 != uVar9) {
                        lVar12 = 1;
                        uVar7 = uVar9;
                        do {
                          lVar11 = lVar11 * uVar7;
                          uVar7 = uVar7 - 1;
                          lVar11 = lVar11 / lVar12;
                          lVar1 = lVar17 + lVar12;
                          lVar12 = lVar12 + 1;
                        } while (lVar1 != 0);
                      }
                    }
                    lVar11 = lVar11 * lVar13;
                  }
                  lVar5 = lVar5 + lVar11;
                  lVar19 = lVar19 + 1;
                  lVar8 = lVar8 + -1;
                  lVar17 = lVar17 + 1;
                } while (lVar19 != uVar18 + 1 + (ulong)(uVar18 == 0xffffffffffffffff));
              }
              lVar5 = lVar5 * local_38;
              pcVar20 = pcVar20 + (uVar18 - 1);
            }
            pfVar14 = local_50;
            pbVar16 = local_40;
            if (bVar21 && uVar15 == 0) break;
          }
          pcVar20 = pcVar20 + 1;
          pcVar6 = (pbVar16->_M_dataplus)._M_p + pbVar16->_M_string_length;
        } while (pcVar20 != pcVar6);
      }
      if (lVar5 != 0) {
        *local_60 = *local_60 + lVar5;
        *local_58 = fVar24 + *local_58;
      }
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 != local_48);
  }
  if (local_88._begin != (float *)0x0) {
    free(local_88._begin);
  }
  return;
}

Assistant:

void eval_count_of_generated_ft(vw& all, example& ec, size_t& new_features_cnt, float& new_features_value)
{
  new_features_cnt = 0;
  new_features_value = 0.;

  v_array<float> results = v_init<float>();

  if (all.permutations)
  {
    // just multiply precomputed values for all namespaces
    for (std::string& inter : all.interactions)
    {
      size_t num_features_in_inter = 1;
      float sum_feat_sq_in_inter = 1.;

      for (namespace_index ns : inter)
      {
        num_features_in_inter *= ec.feature_space[ns].size();
        sum_feat_sq_in_inter *= ec.feature_space[ns].sum_feat_sq;
        if (num_features_in_inter == 0)
          break;
      }

      if (num_features_in_inter == 0)
        continue;

      new_features_cnt += num_features_in_inter;
      new_features_value += sum_feat_sq_in_inter;
    }
  }
  else  // case of simple combinations
  {
#ifdef DEBUG_EVAL_COUNT_OF_GEN_FT
    size_t correct_features_cnt = 0;
    float correct_features_value = 0.;
    eval_gen_data dat(correct_features_cnt, correct_features_value);
    generate_interactions<eval_gen_data, uint64_t, ft_cnt>(all, ec, dat);
#endif

    for (std::string& inter : all.interactions)
    {
      size_t num_features_in_inter = 1;
      float sum_feat_sq_in_inter = 1.;

      for (auto ns = inter.begin(); ns != inter.end(); ++ns)
      {
        if ((ns == inter.end() - 1) || (*ns != *(ns + 1)))  // neighbour namespaces are different
        {
          // just multiply precomputed values
          const int nsc = *ns;
          num_features_in_inter *= ec.feature_space[nsc].size();
          sum_feat_sq_in_inter *= ec.feature_space[nsc].sum_feat_sq;
          if (num_features_in_inter == 0)
            break;  // one of namespaces has no features - go to next interaction
        }
        else  // we are at beginning of a block made of same namespace (interaction is preliminary sorted)
        {
          // let's find out real length of this block
          size_t order_of_inter = 2;  // alredy compared ns == ns+1

          for (auto ns_end = ns + 2; ns_end < inter.end(); ++ns_end)
            if (*ns == *ns_end)
              ++order_of_inter;

          // namespace is same for whole block
          features& fs = ec.feature_space[(const int)*ns];

          // count number of features with value != 1.;
          size_t cnt_ft_value_non_1 = 0;

          // in this block we shall calculate number of generated features and sum of their values
          // keeping in mind rules applicable for simple combinations instead of permutations

          // let's calculate sum of their squared value for whole block

          // ensure results as big as order_of_inter and empty.
          for (size_t i = 0; i < results.size(); ++i) results[i] = 0.;
          while (results.size() < order_of_inter) results.push_back(0.);

          // recurrent value calculations
          for (size_t i = 0; i < fs.size(); ++i)
          {
            const float x = fs.values[i] * fs.values[i];

            if (!PROCESS_SELF_INTERACTIONS(fs.values[i]))
            {
              for (size_t i = order_of_inter - 1; i > 0; --i) results[i] += results[i - 1] * x;

              results[0] += x;
            }
            else
            {
              results[0] += x;

              for (size_t i = 1; i < order_of_inter; ++i) results[i] += results[i - 1] * x;

              ++cnt_ft_value_non_1;
            }
          }

          sum_feat_sq_in_inter *= results[order_of_inter - 1];  // will be explained in http://bit.ly/1Hk9JX1

          // let's calculate  the number of a new features

          // if number of features is less than  order of interaction then go to the next interaction
          // as you can't make simple combination of interaction 'aaa' if a contains < 3 features.
          // unless one of them has value != 1. and we are counting them.
          const size_t ft_size = fs.size();
          if (cnt_ft_value_non_1 == 0 && ft_size < order_of_inter)
          {
            num_features_in_inter = 0;
            break;
          }

          size_t n;
          if (cnt_ft_value_non_1 == 0)  // number of generated simple combinations is C(n,k)
          {
            n = (size_t)choose((int64_t)ft_size, (int64_t)order_of_inter);
          }
          else
          {
            n = 0;
            for (size_t l = 0; l <= order_of_inter; ++l)
            {
              // C(l+m-1, l) * C(n-m, k-l)
              size_t num = (l == 0) ? 1 : (size_t)choose(l + cnt_ft_value_non_1 - 1, l);

              if (ft_size - cnt_ft_value_non_1 >= order_of_inter - l)
                num *= (size_t)choose(ft_size - cnt_ft_value_non_1, order_of_inter - l);
              else
                num = 0;

              n += num;
            }

          }  // details on http://bit.ly/1Hk9JX1

          num_features_in_inter *= n;

          ns += order_of_inter - 1;  // jump over whole block
        }
      }

      if (num_features_in_inter == 0)
        continue;  // signal that values should be ignored (as default value is 1)

      new_features_cnt += num_features_in_inter;
      new_features_value += sum_feat_sq_in_inter;
    }

#ifdef DEBUG_EVAL_COUNT_OF_GEN_FT
    if (correct_features_cnt != new_features_cnt)
      all.trace_message << "Incorrect new features count " << new_features_cnt << " must be " << correct_features_cnt
                        << endl;
    if (fabs(correct_features_value - new_features_value) > 1e-5)
      all.trace_message << "Incorrect new features value " << new_features_value << " must be "
                        << correct_features_value << endl;
#endif
  }

  results.delete_v();
}